

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O1

int __thiscall
TPZCompElHDiv<pzshape::TPZShapeCube>::PreferredSideOrder
          (TPZCompElHDiv<pzshape::TPZShapeCube> *this,int side)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  ostream *poVar4;
  
  iVar1 = pztopology::TPZCube::SideDimension(side);
  iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0xb0))(this);
  if (iVar1 < iVar2 + -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual int TPZCompElHDiv<pzshape::TPZShapeCube>::PreferredSideOrder(int) [TSHAPE = pzshape::TPZShapeCube]"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," side ",6);
    plVar3 = (long *)std::ostream::operator<<(&std::cerr,side);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x250))(this,0,side);
  if ((-1 < iVar1) &&
     (iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x90))(this), iVar1 <= iVar2)) {
    iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x90))(this);
    if (iVar1 < iVar2) {
      return (this->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
             super_TPZInterpolationSpace.fPreferredOrder;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TPZCompElHDiv<TSHAPE>::PreferredSideOrder called for connect = ",0x3f);
    poVar4 = (ostream *)std::ostream::operator<<(&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    return 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "TPZCompElHDiv<TSHAPE>::PreferredSideOrder no polynomial associate ",0x42);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  return -1;
}

Assistant:

int TPZCompElHDiv<TSHAPE>::PreferredSideOrder(int side) {
	if(TSHAPE::SideDimension(side) < Dimension()-1)
	{
		PZError << __PRETTY_FUNCTION__ << " side " << side << std::endl;
	}
	int connect= SideConnectLocId(0,side);
	if(connect<0 || connect > NConnects()) {
		PZError << "TPZCompElHDiv<TSHAPE>::PreferredSideOrder no polynomial associate " <<  endl;
		return -1;
	}
	if(connect<NConnects()) {
			int order =this->fPreferredOrder;
			return order;//this->AdjustPreferredSideOrder(side,order);
	}
	PZError << "TPZCompElHDiv<TSHAPE>::PreferredSideOrder called for connect = " << connect << "\n";
	return 0;

}